

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.c
# Opt level: O0

int property_get(char *key,char *value,char *default_value)

{
  size_t sVar1;
  ssize_t sVar2;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  int len;
  char recvBuf [93];
  char sendBuf [33];
  int local_ac;
  char local_a8;
  char acStack_a7 [95];
  undefined1 local_48;
  char acStack_47 [39];
  char *local_20;
  char *local_18;
  char *local_10;
  int local_4;
  
  local_ac = -1;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  pthread_once(&gInitOnce,init);
  if (gPropFd < 0) {
    if (local_20 != (char *)0x0) {
      strcpy(local_18,local_20);
      sVar1 = strlen(local_18);
      local_ac = (int)sVar1;
    }
    local_4 = local_ac;
  }
  else {
    sVar1 = strlen(local_10);
    if (sVar1 < 0x20) {
      memset(&local_48,0xdd,0x21);
      local_48 = 1;
      strcpy(acStack_47,local_10);
      pthread_mutex_lock((pthread_mutex_t *)&gPropertyFdLock);
      sVar2 = write(gPropFd,&local_48,0x21);
      if (sVar2 == 0x21) {
        sVar2 = read(gPropFd,&local_a8,0x5d);
        if (sVar2 == 0x5d) {
          pthread_mutex_unlock((pthread_mutex_t *)&gPropertyFdLock);
          if (local_a8 == '\0') {
            if (local_20 == (char *)0x0) {
              *local_18 = '\0';
              local_ac = 0;
            }
            else {
              strcpy(local_18,local_20);
              sVar1 = strlen(local_18);
              local_ac = (int)sVar1;
            }
          }
          else {
            if (local_a8 != '\x01') {
              printf("Got strange response to property_get request (%d)\n",
                     (ulong)(uint)(int)local_a8);
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kiddlu[P]android-init-for-linux/libprop/properties.c"
                            ,0x94,"int property_get(const char *, char *, const char *)");
            }
            strcpy(local_18,acStack_a7);
            sVar1 = strlen(local_18);
            local_ac = (int)sVar1;
          }
          local_4 = local_ac;
        }
        else {
          pthread_mutex_unlock((pthread_mutex_t *)&gPropertyFdLock);
          local_4 = -1;
        }
      }
      else {
        pthread_mutex_unlock((pthread_mutex_t *)&gPropertyFdLock);
        local_4 = -1;
      }
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int property_get(const char *key, char *value, const char *default_value)
{
    char sendBuf[1+PROPERTY_KEY_MAX];
    char recvBuf[1+PROPERTY_VALUE_MAX];
    int len = -1;

    //LOGV("PROPERTY GET [%s]\n", key);

    pthread_once(&gInitOnce, init);
    if (gPropFd < 0) {
        /* this mimics the behavior of the device implementation */
        if (default_value != NULL) {
            strcpy(value, default_value);
            len = strlen(value);
        }
        return len;
    }

    if (strlen(key) >= PROPERTY_KEY_MAX) return -1;

    memset(sendBuf, 0xdd, sizeof(sendBuf));    // placate valgrind

    sendBuf[0] = (char) kSystemPropertyGet;
    strcpy(sendBuf+1, key);

    pthread_mutex_lock(&gPropertyFdLock);
    if (write(gPropFd, sendBuf, sizeof(sendBuf)) != sizeof(sendBuf)) {
        pthread_mutex_unlock(&gPropertyFdLock);
        return -1;
    }
    if (read(gPropFd, recvBuf, sizeof(recvBuf)) != sizeof(recvBuf)) {
        pthread_mutex_unlock(&gPropertyFdLock);
        return -1;
    }
    pthread_mutex_unlock(&gPropertyFdLock);

    /* first byte is 0 if value not defined, 1 if found */
    if (recvBuf[0] == 0) {
        if (default_value != NULL) {
            strcpy(value, default_value);
            len = strlen(value);
        } else {
            /*
             * If the value isn't defined, hand back an empty string and
             * a zero length, rather than a failure.  This seems wrong,
             * since you can't tell the difference between "undefined" and
             * "defined but empty", but it's what the device does.
             */
            value[0] = '\0';
            len = 0;
        }
    } else if (recvBuf[0] == 1) {
        strcpy(value, recvBuf+1);
        len = strlen(value);
    } else {
        printf("Got strange response to property_get request (%d)\n",
            recvBuf[0]);
        assert(0);
        return -1;
    }
    //LOGV("PROP [found=%d def='%s'] (%d) [%s]: [%s]\n",
    //    recvBuf[0], default_value, len, key, value);

    return len;
}